

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VGetArrayPointer(N_Vector W,sunindextype param_2,int myid)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  timespec spec;
  timespec local_40;
  
  if (W->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d missing required operations\n",
           (ulong)(uint)myid);
  }
  else {
    clock_gettime(1,&local_40);
    lVar3 = local_40.tv_sec - base_time_tv_sec;
    dVar5 = (double)local_40.tv_nsec;
    puVar2 = (undefined8 *)N_VGetArrayPointer(W);
    clock_gettime(1,&local_40);
    lVar4 = local_40.tv_sec - base_time_tv_sec;
    *puVar2 = 0x3ff0000000000000;
    iVar1 = has_data(W);
    if (iVar1 == 0) {
      printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
      puts("    Vector data == NULL \n");
      return 1;
    }
    N_VConst(0xbfe0000000000000,W);
    iVar1 = check_ans(-0.5,W,param_2);
    if (iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VGetArrayPointer ");
      }
      max_time(W,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar4) -
                 (dVar5 / 1000000000.0 + (double)lVar3));
      if (print_time == 0) {
        return 0;
      }
      printf("%s Time: %22.15e\n\n","N_VGetArrayPointer");
      return 0;
    }
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
    puts("    Failed N_VConst check \n");
  }
  return 1;
}

Assistant:

int Test_N_VGetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype* Wdata;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d missing required "
           "operations\n",
           myid);
    return (1);
  }

  /* get vector data, time it and set it to NULL */
  start_time = get_time();
  Wdata      = N_VGetArrayPointer(W);
  stop_time  = get_time();
  Wdata[0]   = ONE; /* Do something with pointer to surpress warning */

  /* check vector data */
  if (!has_data(W))
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    return (1);
  }

  N_VConst(NEG_HALF, W);
  failure = check_ans(NEG_HALF, W, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    return (1);
  }

  if (myid == 0) { printf("PASSED test -- N_VGetArrayPointer \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VGetArrayPointer", maxt);

  return (0);
}